

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitTableSize
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,TableSize *curr)

{
  ExternalInterface *pEVar1;
  Name NVar2;
  Literal local_a0;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  uint local_6c;
  ModuleRunner *pMStack_68;
  Index tableSize;
  size_t sStack_60;
  long local_50;
  Table *table;
  undefined8 uStack_40;
  undefined1 local_38 [8];
  TableInstanceInfo info;
  TableSize *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  table = *(Table **)(curr + 0x10);
  uStack_40 = *(undefined8 *)(curr + 0x18);
  info.name.super_IString.str._M_str = (char *)curr;
  getTableInstanceInfo((TableInstanceInfo *)local_38,this,(Name)*(string_view *)(curr + 0x10));
  pMStack_68 = info.instance;
  sStack_60 = info.name.super_IString.str._M_len;
  NVar2.super_IString.str._M_str = (char *)info.instance;
  NVar2.super_IString.str._M_len = (size_t)((ModuleRunnerBase<wasm::ModuleRunner> *)local_38)->wasm;
  local_50 = ::wasm::Module::getTable(NVar2);
  pEVar1 = TableInstanceInfo::interface((TableInstanceInfo *)local_38);
  local_88 = *(undefined4 *)(info.name.super_IString.str._M_str + 0x10);
  uStack_84 = *(undefined4 *)(info.name.super_IString.str._M_str + 0x14);
  uStack_80 = *(undefined4 *)(info.name.super_IString.str._M_str + 0x18);
  uStack_7c = *(undefined4 *)(info.name.super_IString.str._M_str + 0x1c);
  local_6c = (*pEVar1->_vptr_ExternalInterface[0x1b])
                       (pEVar1,*(undefined8 *)(info.name.super_IString.str._M_str + 0x10),
                        *(undefined8 *)(info.name.super_IString.str._M_str + 0x18));
  wasm::Literal::makeFromInt64(&local_a0,(ulong)local_6c,(Type)*(uintptr_t *)(local_50 + 0x48));
  Flow::Flow(__return_storage_ptr__,&local_a0);
  ::wasm::Literal::~Literal(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableSize(TableSize* curr) {
    NOTE_ENTER("TableSize");
    auto info = getTableInstanceInfo(curr->table);
    auto* table = info.instance->wasm.getTable(info.name);
    Index tableSize = info.interface()->tableSize(curr->table);
    return Literal::makeFromInt64(tableSize, table->addressType);
  }